

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fair_shared_mutex.hpp
# Opt level: O1

bool __thiscall
yamc::fair::basic_shared_mutex<yamc::rwlock::PhaseFairness>::try_lock
          (basic_shared_mutex<yamc::rwlock::PhaseFairness> *this)

{
  mutex *__mutex;
  node *pnVar1;
  int iVar2;
  
  __mutex = &(this->super_shared_mutex_base<yamc::rwlock::PhaseFairness>).mtx_;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    pnVar1 = (this->super_shared_mutex_base<yamc::rwlock::PhaseFairness>).queue_.next;
    if (pnVar1 == (node *)this) {
      detail::shared_mutex_base<yamc::rwlock::PhaseFairness>::wq_push_locknode
                (&this->super_shared_mutex_base<yamc::rwlock::PhaseFairness>,0);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return pnVar1 == (node *)this;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

bool try_lock()
  {
    std::lock_guard<decltype(mtx_)> lk(mtx_);
    return base::impl_try_lock();
  }